

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void memory_region_init_riscv64(uc_struct_conflict13 *uc,MemoryRegion_conflict *mr,uint64_t size)

{
  uint64_t uVar1;
  
  memset(mr,0,0xa0);
  mr->uc = (uc_struct_conflict12 *)uc;
  mr->ops = &unassigned_mem_ops_riscv64;
  mr->enabled = true;
  mr->destructor = memory_region_destructor_none;
  (mr->subregions).tqh_circ.tql_prev = (QTailQLink *)&mr->subregions;
  uVar1 = 0;
  if (size != 0xffffffffffffffff) {
    uVar1 = size;
  }
  *(uint64_t *)&mr->size = uVar1;
  *(ulong *)((long)&mr->size + 8) = (ulong)(size == 0xffffffffffffffff);
  return;
}

Assistant:

void memory_region_init(struct uc_struct *uc,
                        MemoryRegion *mr,
                        uint64_t size)
{
    memset(mr, 0, sizeof(*mr));
    mr->uc = uc;
    /* memory_region_initfn */
    mr->ops = &unassigned_mem_ops;
    mr->enabled = true;
    mr->destructor = memory_region_destructor_none;
    QTAILQ_INIT(&mr->subregions);

    mr->size = int128_make64(size);
    if (size == UINT64_MAX) {
        mr->size = int128_2_64();
    }
}